

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

boundaries __thiscall
duckdb_fmt::v6::internal::fp::assign_with_boundaries<double>(fp *this,double d)

{
  significand_type sVar1;
  bool bVar2;
  undefined8 extraout_RDX;
  long lVar3;
  char cVar4;
  fp fVar5;
  boundaries bVar6;
  
  bVar2 = assign<double,_0>(this,d);
  sVar1 = this->f;
  cVar4 = (char)this->e;
  if (bVar2) {
    lVar3 = sVar1 * 4;
    cVar4 = cVar4 + -2;
  }
  else {
    lVar3 = sVar1 * 2;
    cVar4 = cVar4 + -1;
  }
  fVar5.f = (ulong)(this->e - 1);
  fVar5._8_8_ = extraout_RDX;
  fVar5 = normalize<1>((internal *)(sVar1 * 2 | 1),fVar5);
  bVar6.upper = fVar5.f;
  bVar6.lower = lVar3 + -1 << (cVar4 - (char)fVar5.e & 0x3fU);
  return bVar6;
}

Assistant:

boundaries assign_with_boundaries(Double d) {
    bool is_lower_closer = assign(d);
    fp lower =
        is_lower_closer ? fp((f << 2) - 1, e - 2) : fp((f << 1) - 1, e - 1);
    // 1 in normalize accounts for the exponent shift above.
    fp upper = normalize<1>(fp((f << 1) + 1, e - 1));
    lower.f <<= lower.e - upper.e;
    return boundaries{lower.f, upper.f};
  }